

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_write_byte(PmInternal *midi,uchar byte,PmTimestamp timestamp)

{
  int iVar1;
  int local_54;
  int local_50;
  int when;
  PmTimestamp now;
  int err;
  snd_seq_event_t ev;
  alsa_descriptor_type desc;
  PmTimestamp timestamp_local;
  uchar byte_local;
  PmInternal *midi_local;
  
  ev.data.ext.ptr = midi->descriptor;
  memset(&now,0,0x1c);
  iVar1 = snd_midi_event_encode_byte(*(undefined8 *)((long)ev.data.ext.ptr + 0x10),byte,&now);
  if (iVar1 == 1) {
    ev.time.tick._2_1_ = (undefined1)*ev.data.ext.ptr;
    ev.time.tick._3_1_ = (undefined1)*(undefined4 *)((long)ev.data.ext.ptr + 4);
    ev.time.tick._1_1_ = (undefined1)*(undefined4 *)((long)ev.data.ext.ptr + 8);
    if (midi->latency < 1) {
      now._3_1_ = 0xfd;
    }
    else {
      if (midi->time_proc == (PmTimeProcPtr)0x0) {
        local_54 = Pt_Time();
      }
      else {
        local_54 = (*midi->time_proc)(midi->time_info);
      }
      local_50 = timestamp;
      if (timestamp == 0) {
        local_50 = local_54;
      }
      local_50 = (local_50 - local_54) + midi->latency;
      if (local_50 < 0) {
        local_50 = 0;
      }
      now._1_1_ = now._1_1_ & 0xfc | 2;
      err = local_50;
      now._3_1_ = (undefined1)queue;
    }
    iVar1 = snd_seq_event_output(seq,&now);
    if (iVar1 < 0) {
      *(int *)((long)ev.data.ext.ptr + 0x18) = iVar1;
      return pmHostError;
    }
  }
  return pmNoData;
}

Assistant:

static PmError alsa_write_byte(PmInternal *midi, unsigned char byte, 
                        PmTimestamp timestamp)
{
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    snd_seq_event_t ev;
    int err;

    snd_seq_ev_clear(&ev);
    if (snd_midi_event_encode_byte(desc->parser, byte, &ev) == 1) {
        snd_seq_ev_set_dest(&ev, desc->client, desc->port);
        snd_seq_ev_set_source(&ev, desc->this_port);
        if (midi->latency > 0) {
            /* compute relative time of event = timestamp - now + latency */
            PmTimestamp now = (midi->time_proc ? 
                               midi->time_proc(midi->time_info) : 
                               Pt_Time(NULL));
            int when = timestamp;
            /* if timestamp is zero, send immediately */
            /* otherwise compute time delay and use delay if positive */
            if (when == 0) when = now;
            when = (when - now) + midi->latency;
            if (when < 0) when = 0;
            VERBOSE printf("timestamp %d now %d latency %d, ", 
                           (int) timestamp, (int) now, midi->latency);
            VERBOSE printf("scheduling event after %d\n", when);
            /* message is sent in relative ticks, where 1 tick = 1 ms */
            snd_seq_ev_schedule_tick(&ev, queue, 1, when);
            /* NOTE: for cases where the user does not supply a time function,
               we could optimize the code by not starting Pt_Time and using
               the alsa tick time instead. I didn't do this because it would
               entail changing the queue management to start the queue tick
               count when PortMidi is initialized and keep it running until
               PortMidi is terminated. (This should be simple, but it's not
               how the code works now.) -RBD */
        } else { /* send event out without queueing */
            VERBOSE printf("direct\n");
            /* ev.queue = SND_SEQ_QUEUE_DIRECT;
               ev.dest.client = SND_SEQ_ADDRESS_SUBSCRIBERS; */
            snd_seq_ev_set_direct(&ev);
        }
        VERBOSE printf("sending event\n");
        err = snd_seq_event_output(seq, &ev);
        if (err < 0) {
            desc->error = err;
            return pmHostError;
        }
    }
    return pmNoError;
}